

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_types.cpp
# Opt level: O0

uint __thiscall glsl_type::cl_alignment(glsl_type *this)

{
  bool bVar1;
  uint uVar2;
  glsl_type *pgVar3;
  uint local_38;
  glsl_struct_field *field;
  uint i;
  uint res;
  glsl_type *this_local;
  
  bVar1 = is_scalar(this);
  if ((bVar1) || (bVar1 = is_vector(this), bVar1)) {
    uVar2 = cl_size(this);
    return uVar2;
  }
  bVar1 = is_array(this);
  if (bVar1) {
    pgVar3 = without_array(this);
    uVar2 = cl_alignment(pgVar3);
    return uVar2;
  }
  bVar1 = is_struct(this);
  if (!bVar1) {
    return 1;
  }
  if ((*(uint *)&this->field_0x4 >> 0x19 & 1) != 0) {
    return 1;
  }
  field._4_4_ = 1;
  for (field._0_4_ = 0; (uint)field < this->length; field._0_4_ = (uint)field + 1) {
    pgVar3 = (this->fields).array;
    uVar2 = cl_alignment(*(glsl_type **)(pgVar3 + (uint)field));
    if (uVar2 < field._4_4_) {
      local_38 = field._4_4_;
    }
    else {
      local_38 = cl_alignment(*(glsl_type **)(pgVar3 + (uint)field));
    }
    field._4_4_ = local_38;
  }
  return field._4_4_;
}

Assistant:

unsigned
glsl_type::cl_alignment() const
{
   /* vectors unlike arrays are aligned to their size */
   if (this->is_scalar() || this->is_vector())
      return this->cl_size();
   else if (this->is_array())
      return this->without_array()->cl_alignment();
   else if (this->is_struct()) {
      /* Packed Structs are 0x1 aligned despite their size. */
      if (this->packed)
         return 1;

      unsigned res = 1;
      for (unsigned i = 0; i < this->length; ++i) {
         struct glsl_struct_field &field = this->fields.structure[i];
         res = MAX2(res, field.type->cl_alignment());
      }
      return res;
   }
   return 1;
}